

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

LOs __thiscall Omega_h::get_degrees(Omega_h *this,LOs *offsets,string *name)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  size_t sVar5;
  long lVar6;
  Alloc *pAVar7;
  Alloc *this_00;
  LOs LVar8;
  Write<int> degrees;
  type f;
  Write<int> local_58;
  Write<int> local_48;
  Alloc *local_38;
  void *local_30;
  Alloc *local_28;
  void *local_20;
  
  pAVar7 = (offsets->write_).shared_alloc_.alloc;
  if (((ulong)pAVar7 & 1) == 0) {
    sVar5 = pAVar7->size;
  }
  else {
    sVar5 = (ulong)pAVar7 >> 3;
  }
  Write<int>::Write(&local_58,(int)(sVar5 >> 2) + -1,name);
  local_38 = local_58.shared_alloc_.alloc;
  if (((ulong)local_58.shared_alloc_.alloc & 7) == 0 && local_58.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_38 = (Alloc *)((local_58.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.shared_alloc_.alloc)->use_count = (local_58.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_30 = local_58.shared_alloc_.direct_ptr;
  local_28 = (offsets->write_).shared_alloc_.alloc;
  if (((ulong)local_28 & 7) == 0 && local_28 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_28 = (Alloc *)(local_28->size * 8 + 1);
    }
    else {
      local_28->use_count = local_28->use_count + 1;
    }
  }
  local_20 = (offsets->write_).shared_alloc_.direct_ptr;
  if (((ulong)local_58.shared_alloc_.alloc & 1) == 0) {
    uVar3 = (local_58.shared_alloc_.alloc)->size;
  }
  else {
    uVar3 = (ulong)local_58.shared_alloc_.alloc >> 3;
  }
  pAVar7 = local_38;
  if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar7 = (Alloc *)(local_38->size * 8 + 1);
    }
    else {
      local_38->use_count = local_38->use_count + 1;
    }
  }
  this_00 = local_28;
  if (((ulong)local_28 & 7) == 0 && local_28 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      this_00 = (Alloc *)(local_28->size * 8 + 1);
    }
    else {
      local_28->use_count = local_28->use_count + 1;
    }
  }
  iVar2 = (int)(uVar3 >> 2);
  if (0 < iVar2) {
    if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
      pAVar7->use_count = pAVar7->use_count + -1;
      pAVar7 = (Alloc *)(pAVar7->size * 8 + 1);
    }
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      this_00->use_count = this_00->use_count + -1;
      this_00 = (Alloc *)(this_00->size * 8 + 1);
    }
    entering_parallel = '\0';
    lVar6 = 0;
    do {
      *(int *)((long)local_58.shared_alloc_.direct_ptr + lVar6 * 4) =
           *(int *)((long)local_20 + lVar6 * 4 + 4) - *(int *)((long)local_20 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (iVar2 != (int)lVar6);
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      piVar1 = &this_00->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
      piVar1 = &pAVar7->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar7);
        operator_delete(pAVar7,0x48);
      }
    }
    pAVar7 = (Alloc *)0x0;
    this_00 = (Alloc *)0x0;
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
    piVar1 = &pAVar7->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar7);
      operator_delete(pAVar7,0x48);
    }
  }
  local_48.shared_alloc_.alloc = local_58.shared_alloc_.alloc;
  local_48.shared_alloc_.direct_ptr = local_58.shared_alloc_.direct_ptr;
  if ((((ulong)local_58.shared_alloc_.alloc & 7) == 0 &&
       local_58.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_58.shared_alloc_.alloc)->use_count = (local_58.shared_alloc_.alloc)->use_count + -1;
    local_48.shared_alloc_.alloc = (Alloc *)((local_58.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_58.shared_alloc_.alloc = (Alloc *)0x0;
  local_58.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,&local_48);
  pAVar7 = local_48.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_48.shared_alloc_.alloc & 7) == 0 && local_48.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_48.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  pAVar7 = local_28;
  if (((ulong)local_28 & 7) == 0 && local_28 != (Alloc *)0x0) {
    piVar1 = &local_28->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_28);
      operator_delete(pAVar7,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  pAVar7 = local_38;
  if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
    piVar1 = &local_38->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38);
      operator_delete(pAVar7,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  pAVar7 = local_58.shared_alloc_.alloc;
  if (((ulong)local_58.shared_alloc_.alloc & 7) == 0 && local_58.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_58.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  LVar8.write_.shared_alloc_.direct_ptr = pvVar4;
  LVar8.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar8.write_.shared_alloc_;
}

Assistant:

LOs get_degrees(LOs offsets, std::string const& name) {
  Write<LO> degrees(offsets.size() - 1, name);
  auto f = OMEGA_H_LAMBDA(LO i) { degrees[i] = offsets[i + 1] - offsets[i]; };
  parallel_for(degrees.size(), f, "get_degrees");
  return degrees;
}